

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser-basetype.cc
# Opt level: O1

bool __thiscall
tinyusdz::ascii::AsciiParser::SepBy1BasicType<tinyusdz::Payload>
          (AsciiParser *this,char sep,char end_symbol,
          vector<tinyusdz::Payload,_std::allocator<tinyusdz::Payload>_> *result)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  Payload *__first;
  Payload *__last;
  StreamReader *pSVar2;
  bool bVar3;
  ulong uVar4;
  undefined7 in_register_00000011;
  undefined7 in_register_00000031;
  char cVar5;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  bool bVar7;
  char c;
  Payload value;
  bool triple_deliminated;
  char local_179;
  undefined4 local_178;
  undefined4 local_174;
  Payload local_170;
  string local_50;
  
  local_178 = (undefined4)CONCAT71(in_register_00000031,sep);
  __first = (result->super__Vector_base<tinyusdz::Payload,_std::allocator<tinyusdz::Payload>_>).
            _M_impl.super__Vector_impl_data._M_start;
  __last = (result->super__Vector_base<tinyusdz::Payload,_std::allocator<tinyusdz::Payload>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  if (__last != __first) {
    ::std::_Destroy_aux<false>::__destroy<tinyusdz::Payload*>(__first,__last);
    (result->super__Vector_base<tinyusdz::Payload,_std::allocator<tinyusdz::Payload>_>)._M_impl.
    super__Vector_impl_data._M_finish = __first;
  }
  bVar3 = SkipWhitespaceAndNewline(this,true);
  if (bVar3) {
    local_174 = (undefined4)CONCAT71(in_register_00000011,end_symbol);
    local_170.asset_path.asset_path_._M_dataplus._M_p =
         (pointer)&local_170.asset_path.asset_path_.field_2;
    local_170.asset_path.asset_path_._M_string_length = 0;
    local_170.asset_path.asset_path_.field_2._M_local_buf[0] = '\0';
    local_170.asset_path.resolved_path_._M_dataplus._M_p =
         (pointer)&local_170.asset_path.resolved_path_.field_2;
    local_170.asset_path.resolved_path_._M_string_length = 0;
    local_170.asset_path.resolved_path_.field_2._M_local_buf[0] = '\0';
    local_170.prim_path._prim_part._M_dataplus._M_p =
         (pointer)&local_170.prim_path._prim_part.field_2;
    local_170.prim_path._prim_part._M_string_length = 0;
    local_170.prim_path._prim_part.field_2._M_local_buf[0] = '\0';
    local_170.prim_path._prop_part._M_dataplus._M_p =
         (pointer)&local_170.prim_path._prop_part.field_2;
    local_170.prim_path._prop_part._M_string_length = 0;
    local_170.prim_path._prop_part.field_2._M_local_buf[0] = '\0';
    local_170.prim_path._variant_part._M_dataplus._M_p =
         (pointer)&local_170.prim_path._variant_part.field_2;
    local_170.prim_path._variant_part._M_string_length = 0;
    local_170.prim_path._variant_part.field_2._M_local_buf[0] = '\0';
    local_170.prim_path._variant_selection_part._M_dataplus._M_p =
         (pointer)&local_170.prim_path._variant_selection_part.field_2;
    local_170.prim_path._variant_selection_part._M_string_length = 0;
    local_170.prim_path._variant_selection_part.field_2._M_local_buf[0] = '\0';
    local_170.prim_path._variant_part_str._M_dataplus._M_p =
         (pointer)&local_170.prim_path._variant_part_str.field_2;
    local_170.prim_path._variant_part_str._M_string_length = 0;
    local_170.prim_path._variant_part_str.field_2._M_local_buf[0] = '\0';
    paVar1 = &local_170.prim_path._element.field_2;
    local_170.prim_path._element._M_string_length = 0;
    local_170.prim_path._element.field_2._M_local_buf[0] = '\0';
    local_170.prim_path._path_type.has_value_ = false;
    local_170.prim_path._path_type.contained = (storage_t<tinyusdz::Path::PathType>)0x0;
    local_170.prim_path._valid = false;
    local_170.layerOffset._offset = 0.0;
    local_170.layerOffset._scale = 1.0;
    local_170.prim_path._element._M_dataplus._M_p = (pointer)paVar1;
    bVar3 = ParsePayload(this,&local_170,(bool *)&local_50);
    if (bVar3) {
      ::std::vector<tinyusdz::Payload,_std::allocator<tinyusdz::Payload>_>::push_back
                (result,&local_170);
    }
    else {
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_50,"Not starting with the value of requested type.\n","");
      PushError(this,&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
    }
    paVar6 = &local_170.asset_path.asset_path_.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_170.prim_path._element._M_dataplus._M_p != paVar1) {
      operator_delete(local_170.prim_path._element._M_dataplus._M_p,
                      CONCAT71(local_170.prim_path._element.field_2._M_allocated_capacity._1_7_,
                               local_170.prim_path._element.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_170.prim_path._variant_part_str._M_dataplus._M_p !=
        &local_170.prim_path._variant_part_str.field_2) {
      operator_delete(local_170.prim_path._variant_part_str._M_dataplus._M_p,
                      CONCAT71(local_170.prim_path._variant_part_str.field_2._M_allocated_capacity.
                               _1_7_,local_170.prim_path._variant_part_str.field_2._M_local_buf[0])
                      + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_170.prim_path._variant_selection_part._M_dataplus._M_p !=
        &local_170.prim_path._variant_selection_part.field_2) {
      operator_delete(local_170.prim_path._variant_selection_part._M_dataplus._M_p,
                      CONCAT71(local_170.prim_path._variant_selection_part.field_2.
                               _M_allocated_capacity._1_7_,
                               local_170.prim_path._variant_selection_part.field_2._M_local_buf[0])
                      + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_170.prim_path._variant_part._M_dataplus._M_p !=
        &local_170.prim_path._variant_part.field_2) {
      operator_delete(local_170.prim_path._variant_part._M_dataplus._M_p,
                      CONCAT71(local_170.prim_path._variant_part.field_2._M_allocated_capacity._1_7_
                               ,local_170.prim_path._variant_part.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_170.prim_path._prop_part._M_dataplus._M_p !=
        &local_170.prim_path._prop_part.field_2) {
      operator_delete(local_170.prim_path._prop_part._M_dataplus._M_p,
                      CONCAT71(local_170.prim_path._prop_part.field_2._M_allocated_capacity._1_7_,
                               local_170.prim_path._prop_part.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_170.prim_path._prim_part._M_dataplus._M_p !=
        &local_170.prim_path._prim_part.field_2) {
      operator_delete(local_170.prim_path._prim_part._M_dataplus._M_p,
                      CONCAT71(local_170.prim_path._prim_part.field_2._M_allocated_capacity._1_7_,
                               local_170.prim_path._prim_part.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_170.asset_path.resolved_path_._M_dataplus._M_p !=
        &local_170.asset_path.resolved_path_.field_2) {
      operator_delete(local_170.asset_path.resolved_path_._M_dataplus._M_p,
                      CONCAT71(local_170.asset_path.resolved_path_.field_2._M_allocated_capacity.
                               _1_7_,local_170.asset_path.resolved_path_.field_2._M_local_buf[0]) +
                      1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_170.asset_path.asset_path_._M_dataplus._M_p != paVar6) {
      operator_delete(local_170.asset_path.asset_path_._M_dataplus._M_p,
                      CONCAT71(local_170.asset_path.asset_path_.field_2._M_allocated_capacity._1_7_,
                               local_170.asset_path.asset_path_.field_2._M_local_buf[0]) + 1);
    }
    if (bVar3) {
      do {
        pSVar2 = this->_sr;
        if ((pSVar2->length_ <= pSVar2->idx_) || (pSVar2->binary_[pSVar2->idx_] == '\0'))
        goto LAB_0039e6bf;
        bVar3 = SkipCommentAndWhitespaceAndNewline(this,true);
        if (!bVar3) {
          return false;
        }
        bVar3 = Char1(this,&local_179);
        cVar5 = '\x01';
        if (bVar3) {
          if (local_179 == (char)local_178) {
            bVar3 = SkipCommentAndWhitespaceAndNewline(this,true);
            if (bVar3) {
              bVar3 = LookChar1(this,(char *)&local_170);
              bVar7 = (char)local_170.asset_path.asset_path_._M_dataplus._M_p == (char)local_174;
              cVar5 = bVar7 * '\x03';
              if (!bVar3) {
                cVar5 = '\x01';
              }
              if (!bVar7 && bVar3) goto LAB_0039e439;
            }
          }
          else {
LAB_0039e439:
            if (local_179 == (char)local_178) {
              cVar5 = '\x01';
              bVar3 = SkipWhitespaceAndNewline(this,true);
              if (bVar3) {
                local_170.asset_path.asset_path_._M_string_length = 0;
                local_170.asset_path.asset_path_.field_2._M_local_buf[0] = '\0';
                local_170.asset_path.resolved_path_._M_dataplus._M_p =
                     (pointer)&local_170.asset_path.resolved_path_.field_2;
                local_170.asset_path.resolved_path_._M_string_length = 0;
                local_170.asset_path.resolved_path_.field_2._M_local_buf[0] = '\0';
                local_170.prim_path._prim_part._M_dataplus._M_p =
                     (pointer)&local_170.prim_path._prim_part.field_2;
                local_170.prim_path._prim_part._M_string_length = 0;
                local_170.prim_path._prim_part.field_2._M_local_buf[0] = '\0';
                local_170.prim_path._prop_part._M_dataplus._M_p =
                     (pointer)&local_170.prim_path._prop_part.field_2;
                local_170.prim_path._prop_part._M_string_length = 0;
                local_170.prim_path._prop_part.field_2._M_local_buf[0] = '\0';
                local_170.prim_path._variant_part._M_dataplus._M_p =
                     (pointer)&local_170.prim_path._variant_part.field_2;
                local_170.prim_path._variant_part._M_string_length = 0;
                local_170.prim_path._variant_part.field_2._M_local_buf[0] = '\0';
                local_170.prim_path._variant_selection_part._M_dataplus._M_p =
                     (pointer)&local_170.prim_path._variant_selection_part.field_2;
                local_170.prim_path._variant_selection_part._M_string_length = 0;
                local_170.prim_path._variant_selection_part.field_2._M_local_buf[0] = '\0';
                local_170.prim_path._variant_part_str._M_dataplus._M_p =
                     (pointer)&local_170.prim_path._variant_part_str.field_2;
                local_170.prim_path._variant_part_str._M_string_length = 0;
                local_170.prim_path._variant_part_str.field_2._M_local_buf[0] = '\0';
                local_170.prim_path._element._M_string_length = 0;
                local_170.prim_path._element.field_2._M_local_buf[0] = '\0';
                local_170.prim_path._path_type.has_value_ = false;
                local_170.prim_path._path_type.contained = (storage_t<tinyusdz::Path::PathType>)0x0;
                local_170.prim_path._valid = false;
                local_170.layerOffset._offset = 0.0;
                local_170.layerOffset._scale = 1.0;
                local_170.asset_path.asset_path_._M_dataplus._M_p = (pointer)paVar6;
                local_170.prim_path._element._M_dataplus._M_p = (pointer)paVar1;
                bVar3 = ParsePayload(this,&local_170,(bool *)&local_50);
                cVar5 = '\x03';
                if (bVar3) {
                  ::std::vector<tinyusdz::Payload,_std::allocator<tinyusdz::Payload>_>::push_back
                            (result,&local_170);
                  cVar5 = '\0';
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_170.prim_path._element._M_dataplus._M_p != paVar1) {
                  operator_delete(local_170.prim_path._element._M_dataplus._M_p,
                                  CONCAT71(local_170.prim_path._element.field_2.
                                           _M_allocated_capacity._1_7_,
                                           local_170.prim_path._element.field_2._M_local_buf[0]) + 1
                                 );
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_170.prim_path._variant_part_str._M_dataplus._M_p !=
                    &local_170.prim_path._variant_part_str.field_2) {
                  operator_delete(local_170.prim_path._variant_part_str._M_dataplus._M_p,
                                  CONCAT71(local_170.prim_path._variant_part_str.field_2.
                                           _M_allocated_capacity._1_7_,
                                           local_170.prim_path._variant_part_str.field_2.
                                           _M_local_buf[0]) + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_170.prim_path._variant_selection_part._M_dataplus._M_p !=
                    &local_170.prim_path._variant_selection_part.field_2) {
                  operator_delete(local_170.prim_path._variant_selection_part._M_dataplus._M_p,
                                  CONCAT71(local_170.prim_path._variant_selection_part.field_2.
                                           _M_allocated_capacity._1_7_,
                                           local_170.prim_path._variant_selection_part.field_2.
                                           _M_local_buf[0]) + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_170.prim_path._variant_part._M_dataplus._M_p !=
                    &local_170.prim_path._variant_part.field_2) {
                  operator_delete(local_170.prim_path._variant_part._M_dataplus._M_p,
                                  CONCAT71(local_170.prim_path._variant_part.field_2.
                                           _M_allocated_capacity._1_7_,
                                           local_170.prim_path._variant_part.field_2._M_local_buf[0]
                                          ) + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_170.prim_path._prop_part._M_dataplus._M_p !=
                    &local_170.prim_path._prop_part.field_2) {
                  operator_delete(local_170.prim_path._prop_part._M_dataplus._M_p,
                                  CONCAT71(local_170.prim_path._prop_part.field_2.
                                           _M_allocated_capacity._1_7_,
                                           local_170.prim_path._prop_part.field_2._M_local_buf[0]) +
                                  1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_170.prim_path._prim_part._M_dataplus._M_p !=
                    &local_170.prim_path._prim_part.field_2) {
                  operator_delete(local_170.prim_path._prim_part._M_dataplus._M_p,
                                  CONCAT71(local_170.prim_path._prim_part.field_2.
                                           _M_allocated_capacity._1_7_,
                                           local_170.prim_path._prim_part.field_2._M_local_buf[0]) +
                                  1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_170.asset_path.resolved_path_._M_dataplus._M_p !=
                    &local_170.asset_path.resolved_path_.field_2) {
                  operator_delete(local_170.asset_path.resolved_path_._M_dataplus._M_p,
                                  CONCAT71(local_170.asset_path.resolved_path_.field_2.
                                           _M_allocated_capacity._1_7_,
                                           local_170.asset_path.resolved_path_.field_2._M_local_buf
                                           [0]) + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_170.asset_path.asset_path_._M_dataplus._M_p != paVar6) {
                  operator_delete(local_170.asset_path.asset_path_._M_dataplus._M_p,
                                  CONCAT71(local_170.asset_path.asset_path_.field_2.
                                           _M_allocated_capacity._1_7_,
                                           local_170.asset_path.asset_path_.field_2._M_local_buf[0])
                                  + 1);
                }
              }
            }
            else {
              pSVar2 = this->_sr;
              cVar5 = '\x03';
              if ((0 < (long)pSVar2->idx_) && (uVar4 = pSVar2->idx_ - 1, uVar4 <= pSVar2->length_))
              {
                pSVar2->idx_ = uVar4;
              }
            }
          }
        }
      } while (cVar5 == '\0');
      if (cVar5 != '\x01') {
LAB_0039e6bf:
        if ((result->super__Vector_base<tinyusdz::Payload,_std::allocator<tinyusdz::Payload>_>).
            _M_impl.super__Vector_impl_data._M_start !=
            (result->super__Vector_base<tinyusdz::Payload,_std::allocator<tinyusdz::Payload>_>).
            _M_impl.super__Vector_impl_data._M_finish) {
          return true;
        }
        local_170.asset_path.asset_path_._M_dataplus._M_p = (pointer)paVar6;
        ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_170,"Empty array.\n","");
        PushError(this,(string *)&local_170);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_170.asset_path.asset_path_._M_dataplus._M_p != paVar6) {
          operator_delete(local_170.asset_path.asset_path_._M_dataplus._M_p,
                          CONCAT71(local_170.asset_path.asset_path_.field_2._M_allocated_capacity.
                                   _1_7_,local_170.asset_path.asset_path_.field_2._M_local_buf[0]) +
                          1);
        }
      }
    }
  }
  return false;
}

Assistant:

bool AsciiParser::SepBy1BasicType(const char sep, const char end_symbol, std::vector<T> *result) {
  result->clear();

  if (!SkipWhitespaceAndNewline()) {
    return false;
  }

  {
    T value;
    if (!ReadBasicType(&value)) {
      PushError("Not starting with the value of requested type.\n");
      return false;
    }

    result->push_back(value);
  }

  while (!Eof()) {
    if (!SkipCommentAndWhitespaceAndNewline()) {
      return false;
    }

    // sep
    char c;
    if (!Char1(&c)) {
      return false;
    }

    if (c == sep) {
      // Look next token
      if (!SkipCommentAndWhitespaceAndNewline()) {
        return false;
      }

      char nc;
      if (!LookChar1(&nc)) {
        return false;
      }

      if (nc == end_symbol) {
        // end
        break;
      }
    }

    if (c != sep) {
      // end
      _sr->seek_from_current(-1);  // unwind single char
      break;
    }

    if (!SkipWhitespaceAndNewline()) {
      return false;
    }

    T value;
    if (!ReadBasicType(&value)) {
      break;
    }

    result->push_back(value);


  }

  if (result->empty()) {
    PushError("Empty array.\n");
    return false;
  }

  return true;
}